

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addProgramOperations(GLES2ThreadedSharingTest *this)

{
  value_type pEVar1;
  reference ppEVar2;
  CreateShader *pCVar3;
  ShaderSource *pSVar4;
  ShaderCompile *pSVar5;
  CreateProgram *this_00;
  AttachShader *pAVar6;
  LinkProgram *pLVar7;
  DetachShader *pDVar8;
  DeleteProgram *pDVar9;
  DeleteShader *pDVar10;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_248;
  undefined1 local_231;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_230;
  undefined1 local_219;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_218;
  undefined1 local_201;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_200;
  undefined1 local_1e9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1e8;
  undefined1 local_1d1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1d0;
  undefined1 local_1b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1b8;
  undefined1 local_1a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1a0;
  undefined1 local_189;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_188;
  undefined1 local_171;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_170;
  undefined1 local_159;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_158;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_148;
  undefined1 local_131;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  undefined1 local_109;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f8;
  undefined1 local_e1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  undefined1 local_c0 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a8;
  undefined1 local_91;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_90;
  undefined1 local_79;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_78;
  undefined1 local_61;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_60;
  char *local_50;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  undefined1 local_30 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  GLES2ThreadedSharingTest *this_local;
  
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  if ((this->m_config).define != 0) {
    fragmentShaderSource =
         "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
    ;
    local_50 = 
    "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n";
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b31,
               (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_61 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_60,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_60,fragmentShaderSource,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_61 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_60);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_79 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_78,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_78,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_79 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_78);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b30,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_91 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_90,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_90,local_50,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_91 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_90);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    program.m_state._7_1_ = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_a8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_a8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    program.m_state._7_1_ = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_a8);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
  ppEVar2 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar2;
  this_00 = (CreateProgram *)operator_new(0x78);
  GLES2ThreadTest::CreateProgram::CreateProgram
            (this_00,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pAVar6 = (AttachShader *)operator_new(0x88);
      local_131 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_120,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_130,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state
                );
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar6,&local_120,&local_130,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_131 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_130);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_120);
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pAVar6 = (AttachShader *)operator_new(0x88);
      local_159 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_148,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_158,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar6,&local_148,&local_158,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_159 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_158);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_148);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pAVar6 = (AttachShader *)operator_new(0x88);
      local_e1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state)
      ;
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar6,&local_d0,&local_e0,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_e1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_e0);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_d0);
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pAVar6 = (AttachShader *)operator_new(0x88);
      local_109 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_f8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_108,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar6,&local_f8,&local_108,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_109 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_108);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_f8);
    }
  }
  if ((this->m_config).modify == 1) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pLVar7 = (LinkProgram *)operator_new(0x78);
      local_189 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_188,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar7,&local_188,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_189 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pLVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_188);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pLVar7 = (LinkProgram *)operator_new(0x78);
      local_171 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_170,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar7,&local_170,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_171 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pLVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_170);
    }
  }
  if ((this->m_config).modify == 2) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pDVar8 = (DetachShader *)operator_new(0x80);
      local_1d1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_1d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar8,&local_1d0,0x8b31,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_1d1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1d0);
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pDVar8 = (DetachShader *)operator_new(0x80);
      local_1e9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_1e8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar8,&local_1e8,0x8b30,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_1e9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1e8);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pDVar8 = (DetachShader *)operator_new(0x80);
      local_1a1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_1a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar8,&local_1a0,0x8b31,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_1a1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1a0);
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pDVar8 = (DetachShader *)operator_new(0x80);
      local_1b9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
                (&local_1b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar8,&local_1b8,0x8b30,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_1b9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1b8);
    }
  }
  if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pDVar9 = (DeleteProgram *)operator_new(0x78);
    local_219 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_218,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar9,&local_218,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_219 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_218);
  }
  else {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar9 = (DeleteProgram *)operator_new(0x78);
    local_201 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_200,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar9,&local_200,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_201 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_200);
  }
  if (((this->m_config).render & 1U) != 0) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar10 = (DeleteShader *)operator_new(0x78);
    local_231 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_230,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar10,&local_230,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_231 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar10);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_230);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar10 = (DeleteShader *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_248,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar10,&local_248,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar10);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_248);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)local_c0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addProgramOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Program> program;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		// Attach shaders
		if (m_config.modify || m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.modify == 1)
	{
		// Link program
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		// Link program
		if (m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.render)
	{
		DE_ASSERT(false);
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}
}